

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_> *
OpenMD::operator&&(ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *cons1,
                  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *cons2)

{
  AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
  *in_RDI;
  LessThanOrEqualToConstraint<int> *in_stack_000001b0;
  GreaterThanOrEqualTo<int> *in_stack_000001b8;
  AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
  *in_stack_000001c0;
  AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
  *this;
  
  this = in_RDI;
  GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo
            ((GreaterThanOrEqualTo<int> *)in_RDI,(GreaterThanOrEqualTo<int> *)in_RDI);
  LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<int> *)this,(LessThanOrEqualToConstraint<int> *)in_RDI);
  AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>::
  AndParamConstraint(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  LessThanOrEqualToConstraint<int>::~LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<int> *)0x257064);
  GreaterThanOrEqualTo<int>::~GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)0x25706e);
  return this;
}

Assistant:

inline AndParamConstraint<Cons1T, Cons2T> operator&&(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return AndParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }